

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.cpp
# Opt level: O3

void __thiscall Hpipe::CbQueue::write_some(CbQueue *this,void *data,PT size)

{
  Buffer *pBVar1;
  PT PVar2;
  Buffer *pBVar3;
  ulong uVar4;
  size_t __n;
  PT PVar5;
  ulong uVar6;
  
  if (size != 0) {
    if (this->beg == (Buffer *)0x0) {
      PVar5 = 0x7e4;
      if (0x7e4 < size) {
        PVar5 = size;
      }
      __n = PVar5 + 7 & 0xfffffffffffffff8;
      pBVar3 = (Buffer *)malloc(__n + 0x1c);
      pBVar3->used = 0;
      pBVar3->size = __n;
      pBVar3->next = (Buffer *)0x0;
      pBVar3->cpt_use = 0;
      this->beg = pBVar3;
      this->end = pBVar3;
      this->off = 0;
    }
    else {
      pBVar3 = this->end;
      uVar4 = pBVar3->size - pBVar3->used;
      uVar6 = size - uVar4;
      if (size < uVar4 || uVar6 == 0) {
        memcpy(pBVar3->data + pBVar3->used,data,size);
        this->end->used = this->end->used + size;
        return;
      }
      memcpy(pBVar3->data + pBVar3->used,data,uVar4);
      data = (void *)((long)data + uVar4);
      pBVar1 = this->end;
      uVar4 = 0x7e4;
      if (0x7e4 < uVar6) {
        uVar4 = uVar6;
      }
      pBVar1->used = pBVar1->size;
      __n = uVar4 + 7 & 0xfffffffffffffff8;
      pBVar3 = (Buffer *)malloc(__n + 0x1c);
      pBVar3->used = 0;
      pBVar3->size = __n;
      pBVar3->next = (Buffer *)0x0;
      pBVar3->cpt_use = 0;
      pBVar1->next = pBVar3;
      this->end = pBVar3;
      size = uVar6;
    }
    if (__n < size) {
      do {
        memcpy(pBVar3->data,data,__n);
        pBVar1 = this->end;
        PVar2 = pBVar1->size;
        data = (void *)((long)data + PVar2);
        pBVar1->used = PVar2;
        size = size - PVar2;
        pBVar3 = (Buffer *)malloc(0x804);
        pBVar3->used = 0;
        __n = 0x7e8;
        pBVar3->size = 0x7e8;
        pBVar3->next = (Buffer *)0x0;
        pBVar3->cpt_use = 0;
        pBVar1->next = pBVar3;
        this->end = pBVar3;
      } while (0x7e8 < size);
    }
    memcpy(pBVar3->data,data,size);
    this->end->used = size;
  }
  return;
}

Assistant:

void CbQueue::write_some( const void *data, PT size ) {
    if ( not size )
        return;

    if ( beg ) {
        PT room = end->room();
        if ( size <= room ) {
            memcpy( end->data + end->used, data, size );
            end->used += size;
            return;
        }
        // -> size > room, buffer with used that may be != 0
        memcpy( end->data + end->used, data, room ); data = reinterpret_cast<const PI8 *>( data ) + room;
        end->used = end->size;
        size -= room;

        end = Buffer::New( std::max( PT( Buffer::default_size ), size ), end );
    } else {
        beg = Buffer::New( std::max( PT( Buffer::default_size ), size ) );
        end = beg;
        off = 0;
    }

    // -> size != 0, buffers with used == 0
    while ( size > end->size ) {
        memcpy( end->data, data, end->size ); data = reinterpret_cast<const PI8 *>( data ) + end->size;
        end->used = end->size;
        size -= end->size;

        end = Buffer::New( Buffer::default_size, end );
    }

    // -> buffer with used == 0, size < Buffer::size
    memcpy( end->data, data, size );
    end->used = size;
}